

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_ClearColor(GPU_Target *target,SDL_Color color)

{
  GPU_Target *target_local;
  SDL_Color color_local;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    GPU_PushErrorCode("GPU_ClearColor",GPU_ERROR_USER_ERROR,"%s","NULL renderer");
  }
  else {
    if (((_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) &&
        (target != (GPU_Target *)0x0)) && (target->context != (GPU_Context *)0x0)) {
      GPU_MakeCurrent(target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) {
      GPU_PushErrorCode("GPU_ClearColor",GPU_ERROR_USER_ERROR,"%s","NULL context");
    }
    else {
      target_local._4_1_ = color.r;
      target_local._5_1_ = color.g;
      target_local._6_1_ = color.b;
      target_local._7_1_ = color.a;
      (*_gpu_current_renderer->impl->ClearRGBA)
                (_gpu_current_renderer,target,target_local._4_1_,target_local._5_1_,
                 target_local._6_1_,target_local._7_1_);
    }
  }
  return;
}

Assistant:

void GPU_ClearColor(GPU_Target* target, SDL_Color color)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    _gpu_current_renderer->impl->ClearRGBA(_gpu_current_renderer, target, color.r, color.g, color.b, GET_ALPHA(color));
}